

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O0

bool __thiscall
aiMetadata::Get<aiVector3t<float>>(aiMetadata *this,uint index,aiVector3t<float> *value)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  aiMetadataType aVar3;
  aiVector3t<float> *value_local;
  uint index_local;
  aiMetadata *this_local;
  
  if (index < this->mNumProperties) {
    aVar3 = GetAiType(value);
    if (aVar3 == this->mValues[index].mType) {
      puVar1 = (undefined8 *)this->mValues[index].mData;
      uVar2 = *puVar1;
      value->x = (float)(int)uVar2;
      value->y = (float)(int)((ulong)uVar2 >> 0x20);
      value->z = *(float *)(puVar1 + 1);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline 
    bool Get( unsigned index, T& value ) const {
        // In range assertion
        if ( index >= mNumProperties ) {
            return false;
        }

        // Return false if the output data type does
        // not match the found value's data type
        if ( GetAiType( value ) != mValues[ index ].mType ) {
            return false;
        }

        // Otherwise, output the found value and
        // return true
        value = *static_cast<T*>(mValues[index].mData);

        return true;
    }